

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void calc_vector_mean_sse_64wd(int16_t *ref,int16_t *src,__m256i *mean,__m256i *sse)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i diff_sqr3;
  __m256i diff_sqr2;
  __m256i diff_sqr1;
  __m256i diff_sqr0;
  __m256i diff3;
  __m256i diff2;
  __m256i diff1;
  __m256i diff0;
  __m256i ref_line3;
  __m256i ref_line2;
  __m256i ref_line1;
  __m256i ref_line0;
  __m256i src_line3;
  __m256i src_line2;
  __m256i src_line1;
  __m256i src_line0;
  
  auVar5 = vpsubw_avx2(*in_RDI,*in_RSI);
  auVar6 = vpsubw_avx2(in_RDI[1],in_RSI[1]);
  auVar7 = vpsubw_avx2(in_RDI[2],in_RSI[2]);
  auVar8 = vpsubw_avx2(in_RDI[3],in_RSI[3]);
  auVar1 = vpmaddwd_avx2(auVar5,auVar5);
  auVar2 = vpmaddwd_avx2(auVar6,auVar6);
  auVar3 = vpmaddwd_avx2(auVar7,auVar7);
  auVar4 = vpmaddwd_avx2(auVar8,auVar8);
  auVar5 = vpaddw_avx2(auVar5,auVar6);
  auVar5 = vpaddw_avx2(*in_RDX,auVar5);
  *in_RDX = auVar5;
  auVar5 = vpaddw_avx2(*in_RDX,auVar7);
  *in_RDX = auVar5;
  auVar5 = vpaddw_avx2(*in_RDX,auVar8);
  *in_RDX = auVar5;
  auVar5 = vpaddd_avx2(auVar1,auVar2);
  auVar5 = vpaddd_avx2(*in_RCX,auVar5);
  *in_RCX = auVar5;
  auVar5 = vpaddd_avx2(*in_RCX,auVar3);
  *in_RCX = auVar5;
  auVar5 = vpaddd_avx2(*in_RCX,auVar4);
  *in_RCX = auVar5;
  return;
}

Assistant:

static inline void calc_vector_mean_sse_64wd(const int16_t *ref,
                                             const int16_t *src, __m256i *mean,
                                             __m256i *sse) {
  const __m256i src_line0 = _mm256_loadu_si256((const __m256i *)src);
  const __m256i src_line1 = _mm256_loadu_si256((const __m256i *)(src + 16));
  const __m256i src_line2 = _mm256_loadu_si256((const __m256i *)(src + 32));
  const __m256i src_line3 = _mm256_loadu_si256((const __m256i *)(src + 48));
  const __m256i ref_line0 = _mm256_loadu_si256((const __m256i *)ref);
  const __m256i ref_line1 = _mm256_loadu_si256((const __m256i *)(ref + 16));
  const __m256i ref_line2 = _mm256_loadu_si256((const __m256i *)(ref + 32));
  const __m256i ref_line3 = _mm256_loadu_si256((const __m256i *)(ref + 48));

  const __m256i diff0 = _mm256_sub_epi16(ref_line0, src_line0);
  const __m256i diff1 = _mm256_sub_epi16(ref_line1, src_line1);
  const __m256i diff2 = _mm256_sub_epi16(ref_line2, src_line2);
  const __m256i diff3 = _mm256_sub_epi16(ref_line3, src_line3);
  const __m256i diff_sqr0 = _mm256_madd_epi16(diff0, diff0);
  const __m256i diff_sqr1 = _mm256_madd_epi16(diff1, diff1);
  const __m256i diff_sqr2 = _mm256_madd_epi16(diff2, diff2);
  const __m256i diff_sqr3 = _mm256_madd_epi16(diff3, diff3);

  *mean = _mm256_add_epi16(*mean, _mm256_add_epi16(diff0, diff1));
  *mean = _mm256_add_epi16(*mean, diff2);
  *mean = _mm256_add_epi16(*mean, diff3);
  *sse = _mm256_add_epi32(*sse, _mm256_add_epi32(diff_sqr0, diff_sqr1));
  *sse = _mm256_add_epi32(*sse, diff_sqr2);
  *sse = _mm256_add_epi32(*sse, diff_sqr3);
}